

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetSchemaSpecification
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,ValueType *document)

{
  SchemaDraft SVar1;
  OpenApiVersion OVar2;
  Specification SVar3;
  ulong uVar4;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_58;
  
  SVar3.draft = GetSchemaDraft(document);
  OVar2 = GetOpenApiVersion(document);
  if (OVar2 != kVersionNone && SVar3.draft != kDraftNone) {
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecIllegal,&local_58);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_58);
  }
  if (SVar3.draft == kDraftNone) {
    if (OVar2 != kVersionNone) {
      uVar4 = 9;
      if (OVar2 != kVersion31) {
        uVar4 = (ulong)(OVar2 == kVersion30) | 4;
      }
      this->spec_ = (Specification)((ulong)(uint)OVar2 << 0x20 | uVar4);
    }
  }
  else {
    SVar3.oapi = kVersionNone;
    this->spec_ = SVar3;
  }
  SVar1 = (this->spec_).draft;
  if ((SVar1 == kDraftUnknown) || ((this->spec_).oapi == kVersionUnknown)) {
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecUnknown,&local_58);
  }
  else {
    if ((((SVar1 & 0xfffffffe) == kDraft04) && (OVar2 = (this->spec_).oapi, (uint)OVar2 < 4)) &&
       (OVar2 != 1)) {
      return;
    }
    local_58.tokenCount_ = 0;
    local_58.parseErrorOffset_ = 0;
    local_58.nameBuffer_ = (Ch *)0x0;
    local_58.tokens_ = (Token *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.parseErrorCode_ = kPointerParseErrorNone;
    SchemaError(this,kSchemaErrorSpecUnsupported,&local_58);
  }
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer(&local_58);
  return;
}

Assistant:

void SetSchemaSpecification(const ValueType& document) {
        // Look for '$schema', 'swagger' or 'openapi' keyword at document root
        SchemaDraft docDraft = GetSchemaDraft(document);
        OpenApiVersion docOapi = GetOpenApiVersion(document);
        // Error if both in document
        if (docDraft != kDraftNone && docOapi != kVersionNone)
          SchemaError(kSchemaErrorSpecIllegal, PointerType());
        // Use document draft or open api version if present or use spec from constructor
        if (docDraft != kDraftNone)
            spec_ = Specification(docDraft);
        else if (docOapi != kVersionNone)
            spec_ = Specification(docOapi);
        // Error if draft or version unknown
        if (spec_.draft == kDraftUnknown || spec_.oapi == kVersionUnknown)
          SchemaError(kSchemaErrorSpecUnknown, PointerType());
        else if (!spec_.IsSupported())
            SchemaError(kSchemaErrorSpecUnsupported, PointerType());
    }